

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_cache.cpp
# Opt level: O3

void __thiscall libtorrent::aux::stat_cache::set_dirty(stat_cache *this,file_index_t i)

{
  pointer psVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    psVar1 = (this->m_stat_cache).
             super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
             .
             super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (i.m_val < (int)((ulong)((long)(this->m_stat_cache).
                                      super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                                      .
                                      super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1) >>
                       3)) {
      psVar1[i.m_val].file_size = -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void stat_cache::set_dirty(file_index_t const i)
	{
		std::lock_guard<std::mutex> l(m_mutex);
		if (i >= m_stat_cache.end_index()) return;
		m_stat_cache[i].file_size = not_in_cache;
	}